

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntConv.H
# Opt level: O2

void amrex::readIntData<long,long>(long *data,size_t size,istream *is,IntDescriptor *id)

{
  Ordering OVar1;
  Ordering OVar2;
  long in_RAX;
  IntDescriptor *this;
  size_t j;
  size_t sVar3;
  long value;
  
  value = in_RAX;
  OVar1 = IntDescriptor::order(id);
  this = FPC::NativeIntDescriptor();
  OVar2 = IntDescriptor::order(this);
  for (sVar3 = 0; size != sVar3; sVar3 = sVar3 + 1) {
    std::istream::read((char *)is,(long)&value);
    if (OVar1 != OVar2) {
      value = swapBytes(value);
    }
    data[sVar3] = value;
  }
  return;
}

Assistant:

void readIntData (To* data, std::size_t size, std::istream& is,
                      const amrex::IntDescriptor& id)
    {
        From value;
        bool swapEndian = (id.order() != amrex::FPC::NativeIntDescriptor().order());
        for (std::size_t j = 0; j < size; ++j) {
            is.read((char*) &value, sizeof(From));
            if (swapEndian) value = swapBytes(value);
            data[j] = static_cast<To>(value);
        }
    }